

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::SizeStatistics::SizeStatistics(SizeStatistics *this,SizeStatistics *other12)

{
  *(undefined ***)this = &PTR__SizeStatistics_027d5c98;
  (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  this->__isset = (_SizeStatistics__isset)((byte)this->__isset & 0xf8);
  this->unencoded_byte_array_data_bytes = other12->unencoded_byte_array_data_bytes;
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &(other12->repetition_level_histogram).super_vector<long,_std::allocator<long>_>);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->definition_level_histogram).super_vector<long,_std::allocator<long>_>,
             &(other12->definition_level_histogram).super_vector<long,_std::allocator<long>_>);
  this->__isset = other12->__isset;
  return;
}

Assistant:

SizeStatistics::SizeStatistics(const SizeStatistics& other12) {
  unencoded_byte_array_data_bytes = other12.unencoded_byte_array_data_bytes;
  repetition_level_histogram = other12.repetition_level_histogram;
  definition_level_histogram = other12.definition_level_histogram;
  __isset = other12.__isset;
}